

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

char * min_expand(MatchState *ms,char *s,char *p,char *ep)

{
  int iVar1;
  char *pcVar2;
  char *res;
  char *ep_local;
  char *p_local;
  char *s_local;
  MatchState *ms_local;
  
  p_local = s;
  while( true ) {
    pcVar2 = match(ms,p_local,ep + 1);
    if (pcVar2 != (char *)0x0) {
      return pcVar2;
    }
    if ((ms->src_end <= p_local) || (iVar1 = singlematch((uint)(byte)*p_local,p,ep), iVar1 == 0))
    break;
    p_local = p_local + 1;
  }
  return (char *)0x0;
}

Assistant:

static const char *min_expand(MatchState *ms, const char *s,
			      const char *p, const char *ep)
{
  for (;;) {
    const char *res = match(ms, s, ep+1);
    if (res != NULL)
      return res;
    else if (s<ms->src_end && singlematch(uchar(*s), p, ep))
      s++;  /* try with one more repetition */
    else
      return NULL;
  }
}